

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

size_t encodeUTF8(char *s,uint ch)

{
  byte bVar1;
  size_t sStack_8;
  
  bVar1 = (byte)ch;
  if (ch < 0x80) {
    *s = bVar1;
    sStack_8 = 1;
  }
  else if (ch < 0x800) {
    *s = (byte)(ch >> 6) | 0xc0;
    s[1] = bVar1 & 0x3f | 0x80;
    sStack_8 = 2;
  }
  else if (ch < 0x10000) {
    *s = (byte)(ch >> 0xc) | 0xe0;
    s[1] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[2] = bVar1 & 0x3f | 0x80;
    sStack_8 = 3;
  }
  else {
    if (0x10ffff < ch) {
      return 0;
    }
    *s = (byte)(ch >> 0x12) | 0xf0;
    s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[3] = bVar1 & 0x3f | 0x80;
    sStack_8 = 4;
  }
  return sStack_8;
}

Assistant:

static size_t encodeUTF8(char* s, unsigned int ch)
{
    size_t count = 0;

    if (ch < 0x80)
        s[count++] = (char) ch;
    else if (ch < 0x800)
    {
        s[count++] = (ch >> 6) | 0xc0;
        s[count++] = (ch & 0x3f) | 0x80;
    }
    else if (ch < 0x10000)
    {
        s[count++] = (ch >> 12) | 0xe0;
        s[count++] = ((ch >> 6) & 0x3f) | 0x80;
        s[count++] = (ch & 0x3f) | 0x80;
    }
    else if (ch < 0x110000)
    {
        s[count++] = (ch >> 18) | 0xf0;
        s[count++] = ((ch >> 12) & 0x3f) | 0x80;
        s[count++] = ((ch >> 6) & 0x3f) | 0x80;
        s[count++] = (ch & 0x3f) | 0x80;
    }

    return count;
}